

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cc
# Opt level: O0

ssize_t __thiscall testbench::memory::read(memory *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined7 extraout_var;
  reference psVar4;
  element_type *peVar5;
  undefined7 uVar6;
  undefined1 local_48 [8];
  shared_ptr<testbench::address_range> range;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>
  *__range1;
  uint address_local;
  memory *this_local;
  
  __end1 = std::
           vector<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>
           ::begin(&this->ranges);
  range.super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>
       ::end(&this->ranges);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<testbench::address_range>_*,_std::vector<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>_>
                                     *)&range.
                                        super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount), bVar1) {
    psVar4 = __gnu_cxx::
             __normal_iterator<const_std::shared_ptr<testbench::address_range>_*,_std::vector<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<testbench::address_range>::shared_ptr
              ((shared_ptr<testbench::address_range> *)local_48,psVar4);
    peVar5 = std::
             __shared_ptr_access<testbench::address_range,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<testbench::address_range,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
    uVar2 = (*peVar5->_vptr_address_range[1])();
    if ((uVar2 & 1) == 0) {
LAB_0010d725:
      bVar1 = false;
    }
    else {
      peVar5 = std::
               __shared_ptr_access<testbench::address_range,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<testbench::address_range,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
      uVar2 = (*peVar5->_vptr_address_range[2])(peVar5,(ulong)(uint)__fd);
      if ((uVar2 & 1) == 0) goto LAB_0010d725;
      peVar5 = std::
               __shared_ptr_access<testbench::address_range,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<testbench::address_range,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
      iVar3 = (*peVar5->_vptr_address_range[3])(peVar5,(ulong)(uint)__fd);
      this_local._7_1_ = (undefined1)iVar3;
      bVar1 = true;
    }
    std::shared_ptr<testbench::address_range>::~shared_ptr
              ((shared_ptr<testbench::address_range> *)local_48);
    uVar6 = 0;
    if (bVar1) goto LAB_0010d754;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<testbench::address_range>_*,_std::vector<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>_>
    ::operator++(&__end1);
  }
  this_local._7_1_ = 0;
  uVar6 = extraout_var;
LAB_0010d754:
  return CONCAT71(uVar6,this_local._7_1_);
}

Assistant:

unsigned char memory::read(unsigned address) const noexcept
{
    for (auto range : ranges) {
        if (range->is_visible() and range->contains(address)) {
            return range->read(address);
        }
    }
    return 0;
}